

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O0

void __thiscall rr::Renderer::drawInstanced(Renderer *this,DrawCommand *command,int numInstances)

{
  float fVar1;
  value_type pVVar2;
  VertexAttrib *pVVar3;
  VertexShader *pVVar4;
  RenderState *pRVar5;
  RenderTarget *pRVar6;
  Program *pPVar7;
  ulong uVar8;
  int iVar9;
  bool bVar10;
  PrimitiveType PVar11;
  size_t sVar12;
  vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_> *this_00;
  size_type numberOfVertexOutputs;
  reference ppVVar13;
  bool local_da;
  byte local_d9;
  Vector<float,_4> local_ac;
  uint local_9c;
  ulong uStack_98;
  int numVertexPackets;
  size_t elementNdx;
  DrawContext local_88;
  int instanceID;
  DrawContext drawContext;
  undefined1 local_78 [8];
  vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> vertexPackets;
  VertexPacketAllocator vpalloc;
  size_t numVaryings;
  bool validCommand;
  int numInstances_local;
  DrawCommand *command_local;
  Renderer *this_local;
  
  bVar10 = anon_unknown_19::isValidCommand(command,numInstances);
  if (((bVar10) && (sVar12 = PrimitiveList::getNumElements(command->primitives), sVar12 != 0)) &&
     (numInstances != 0)) {
    this_00 = VertexShader::getOutputs(command->program->vertexShader);
    numberOfVertexOutputs =
         std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::size(this_00);
    VertexPacketAllocator::VertexPacketAllocator
              ((VertexPacketAllocator *)
               &vertexPackets.
                super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,numberOfVertexOutputs);
    sVar12 = PrimitiveList::getNumElements(command->primitives);
    VertexPacketAllocator::allocArray
              ((vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *)local_78,
               (VertexPacketAllocator *)
               &vertexPackets.
                super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,sVar12);
    anon_unknown_19::DrawContext::DrawContext(&local_88);
    for (elementNdx._4_4_ = 0; elementNdx._4_4_ < numInstances;
        elementNdx._4_4_ = elementNdx._4_4_ + 1) {
      local_88.primitiveID = 0;
      for (uStack_98 = 0; uVar8 = uStack_98,
          sVar12 = PrimitiveList::getNumElements(command->primitives), uVar8 < sVar12;
          uStack_98 = uStack_98 + 1) {
        local_9c = 0;
        while( true ) {
          uVar8 = uStack_98;
          sVar12 = PrimitiveList::getNumElements(command->primitives);
          local_d9 = 0;
          if (uVar8 < sVar12) {
            local_da = false;
            if (((command->state->restart).enabled & 1U) != 0) {
              local_da = PrimitiveList::isRestartIndex
                                   (command->primitives,uStack_98,
                                    (command->state->restart).restartIndex);
            }
            local_d9 = local_da ^ 0xff;
          }
          iVar9 = elementNdx._4_4_;
          if ((local_d9 & 1) == 0) break;
          ppVVar13 = std::vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::
                     operator[]((vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *)
                                local_78,(long)(int)local_9c);
          (*ppVVar13)->instanceNdx = iVar9;
          sVar12 = PrimitiveList::getIndex(command->primitives,uStack_98);
          ppVVar13 = std::vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::
                     operator[]((vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *)
                                local_78,(long)(int)local_9c);
          (*ppVVar13)->vertexNdx = (int)sVar12;
          fVar1 = (command->state->point).pointSize;
          ppVVar13 = std::vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::
                     operator[]((vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *)
                                local_78,(long)(int)local_9c);
          (*ppVVar13)->pointSize = fVar1;
          tcu::Vector<float,_4>::Vector(&local_ac,0.0,0.0,0.0,0.0);
          ppVVar13 = std::vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::
                     operator[]((vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *)
                                local_78,(long)(int)local_9c);
          pVVar2 = *ppVVar13;
          *(undefined8 *)(pVVar2->position).m_data = local_ac.m_data._0_8_;
          *(undefined8 *)((pVVar2->position).m_data + 2) = local_ac.m_data._8_8_;
          local_9c = local_9c + 1;
          uStack_98 = uStack_98 + 1;
        }
        if (local_9c != 0) {
          pVVar3 = command->vertexAttribs;
          pVVar4 = command->program->vertexShader;
          ppVVar13 = std::vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::
                     operator[]((vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *)
                                local_78,0);
          (**pVVar4->_vptr_VertexShader)(pVVar4,pVVar3,ppVVar13,(ulong)local_9c);
          PVar11 = PrimitiveList::getPrimitiveType(command->primitives);
          switch(PVar11) {
          case PRIMITIVETYPE_TRIANGLES:
            pRVar5 = command->state;
            pRVar6 = command->renderTarget;
            pPVar7 = command->program;
            ppVVar13 = std::vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::
                       operator[]((vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *
                                  )local_78,0);
            anon_unknown_19::drawAsPrimitives<(rr::PrimitiveType)0>
                      (pRVar5,pRVar6,pPVar7,ppVVar13,local_9c,&local_88,
                       (VertexPacketAllocator *)
                       &vertexPackets.
                        super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
            break;
          case PRIMITIVETYPE_TRIANGLE_STRIP:
            pRVar5 = command->state;
            pRVar6 = command->renderTarget;
            pPVar7 = command->program;
            ppVVar13 = std::vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::
                       operator[]((vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *
                                  )local_78,0);
            anon_unknown_19::drawAsPrimitives<(rr::PrimitiveType)1>
                      (pRVar5,pRVar6,pPVar7,ppVVar13,local_9c,&local_88,
                       (VertexPacketAllocator *)
                       &vertexPackets.
                        super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
            break;
          case PRIMITIVETYPE_TRIANGLE_FAN:
            pRVar5 = command->state;
            pRVar6 = command->renderTarget;
            pPVar7 = command->program;
            ppVVar13 = std::vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::
                       operator[]((vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *
                                  )local_78,0);
            anon_unknown_19::drawAsPrimitives<(rr::PrimitiveType)2>
                      (pRVar5,pRVar6,pPVar7,ppVVar13,local_9c,&local_88,
                       (VertexPacketAllocator *)
                       &vertexPackets.
                        super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
            break;
          case PRIMITIVETYPE_LINES:
            pRVar5 = command->state;
            pRVar6 = command->renderTarget;
            pPVar7 = command->program;
            ppVVar13 = std::vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::
                       operator[]((vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *
                                  )local_78,0);
            anon_unknown_19::drawAsPrimitives<(rr::PrimitiveType)3>
                      (pRVar5,pRVar6,pPVar7,ppVVar13,local_9c,&local_88,
                       (VertexPacketAllocator *)
                       &vertexPackets.
                        super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
            break;
          case PRIMITIVETYPE_LINE_STRIP:
            pRVar5 = command->state;
            pRVar6 = command->renderTarget;
            pPVar7 = command->program;
            ppVVar13 = std::vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::
                       operator[]((vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *
                                  )local_78,0);
            anon_unknown_19::drawAsPrimitives<(rr::PrimitiveType)4>
                      (pRVar5,pRVar6,pPVar7,ppVVar13,local_9c,&local_88,
                       (VertexPacketAllocator *)
                       &vertexPackets.
                        super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
            break;
          case PRIMITIVETYPE_LINE_LOOP:
            pRVar5 = command->state;
            pRVar6 = command->renderTarget;
            pPVar7 = command->program;
            ppVVar13 = std::vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::
                       operator[]((vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *
                                  )local_78,0);
            anon_unknown_19::drawAsPrimitives<(rr::PrimitiveType)5>
                      (pRVar5,pRVar6,pPVar7,ppVVar13,local_9c,&local_88,
                       (VertexPacketAllocator *)
                       &vertexPackets.
                        super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
            break;
          case PRIMITIVETYPE_POINTS:
            pRVar5 = command->state;
            pRVar6 = command->renderTarget;
            pPVar7 = command->program;
            ppVVar13 = std::vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::
                       operator[]((vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *
                                  )local_78,0);
            anon_unknown_19::drawAsPrimitives<(rr::PrimitiveType)6>
                      (pRVar5,pRVar6,pPVar7,ppVVar13,local_9c,&local_88,
                       (VertexPacketAllocator *)
                       &vertexPackets.
                        super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
            break;
          case PRIMITIVETYPE_LINES_ADJACENCY:
            pRVar5 = command->state;
            pRVar6 = command->renderTarget;
            pPVar7 = command->program;
            ppVVar13 = std::vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::
                       operator[]((vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *
                                  )local_78,0);
            anon_unknown_19::drawAsPrimitives<(rr::PrimitiveType)7>
                      (pRVar5,pRVar6,pPVar7,ppVVar13,local_9c,&local_88,
                       (VertexPacketAllocator *)
                       &vertexPackets.
                        super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
            break;
          case PRIMITIVETYPE_LINE_STRIP_ADJACENCY:
            pRVar5 = command->state;
            pRVar6 = command->renderTarget;
            pPVar7 = command->program;
            ppVVar13 = std::vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::
                       operator[]((vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *
                                  )local_78,0);
            anon_unknown_19::drawAsPrimitives<(rr::PrimitiveType)8>
                      (pRVar5,pRVar6,pPVar7,ppVVar13,local_9c,&local_88,
                       (VertexPacketAllocator *)
                       &vertexPackets.
                        super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
            break;
          case PRIMITIVETYPE_TRIANGLES_ADJACENCY:
            pRVar5 = command->state;
            pRVar6 = command->renderTarget;
            pPVar7 = command->program;
            ppVVar13 = std::vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::
                       operator[]((vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *
                                  )local_78,0);
            anon_unknown_19::drawAsPrimitives<(rr::PrimitiveType)9>
                      (pRVar5,pRVar6,pPVar7,ppVVar13,local_9c,&local_88,
                       (VertexPacketAllocator *)
                       &vertexPackets.
                        super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
            break;
          case PRIMITIVETYPE_TRIANGLE_STRIP_ADJACENCY:
            pRVar5 = command->state;
            pRVar6 = command->renderTarget;
            pPVar7 = command->program;
            ppVVar13 = std::vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::
                       operator[]((vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *
                                  )local_78,0);
            anon_unknown_19::drawAsPrimitives<(rr::PrimitiveType)10>
                      (pRVar5,pRVar6,pPVar7,ppVVar13,local_9c,&local_88,
                       (VertexPacketAllocator *)
                       &vertexPackets.
                        super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
          }
        }
      }
    }
    std::vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::~vector
              ((vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *)local_78);
    VertexPacketAllocator::~VertexPacketAllocator
              ((VertexPacketAllocator *)
               &vertexPackets.
                super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

void Renderer::drawInstanced (const DrawCommand& command, int numInstances) const
{
	// Do not run bad commands
	{
		const bool validCommand = isValidCommand(command, numInstances);
		if (!validCommand)
		{
			DE_ASSERT(false);
			return;
		}
	}

	// Do not draw if nothing to draw
	{
		if (command.primitives.getNumElements() == 0 || numInstances == 0)
			return;
	}

	// Prepare transformation

	const size_t				numVaryings = command.program.vertexShader->getOutputs().size();
	VertexPacketAllocator		vpalloc(numVaryings);
	std::vector<VertexPacket*>	vertexPackets = vpalloc.allocArray(command.primitives.getNumElements());
	DrawContext					drawContext;

	for (int instanceID = 0; instanceID < numInstances; ++instanceID)
	{
		// Each instance has its own primitives
		drawContext.primitiveID = 0;

		for (size_t elementNdx = 0; elementNdx < command.primitives.getNumElements(); ++elementNdx)
		{
			int numVertexPackets = 0;

			// collect primitive vertices until restart

			while (elementNdx < command.primitives.getNumElements() &&
					!(command.state.restart.enabled && command.primitives.isRestartIndex(elementNdx, command.state.restart.restartIndex)))
			{
				// input
				vertexPackets[numVertexPackets]->instanceNdx	= instanceID;
				vertexPackets[numVertexPackets]->vertexNdx		= (int)command.primitives.getIndex(elementNdx);

				// output
				vertexPackets[numVertexPackets]->pointSize		= command.state.point.pointSize;	// default value from the current state
				vertexPackets[numVertexPackets]->position		= tcu::Vec4(0, 0, 0, 0);			// no undefined values

				++numVertexPackets;
				++elementNdx;
			}

			// Duplicated restart shade
			if (numVertexPackets == 0)
				continue;

			// \todo Vertex cache?

			// Transform vertices

			command.program.vertexShader->shadeVertices(command.vertexAttribs, &vertexPackets[0], numVertexPackets);

			// Draw primitives

			switch (command.primitives.getPrimitiveType())
			{
				case PRIMITIVETYPE_TRIANGLES:				{ drawAsPrimitives<PRIMITIVETYPE_TRIANGLES>					(command.state, command.renderTarget, command.program, &vertexPackets[0], numVertexPackets, drawContext, vpalloc);	break; }
				case PRIMITIVETYPE_TRIANGLE_STRIP:			{ drawAsPrimitives<PRIMITIVETYPE_TRIANGLE_STRIP>			(command.state, command.renderTarget, command.program, &vertexPackets[0], numVertexPackets, drawContext, vpalloc);	break; }
				case PRIMITIVETYPE_TRIANGLE_FAN:			{ drawAsPrimitives<PRIMITIVETYPE_TRIANGLE_FAN>				(command.state, command.renderTarget, command.program, &vertexPackets[0], numVertexPackets, drawContext, vpalloc);	break; }
				case PRIMITIVETYPE_LINES:					{ drawAsPrimitives<PRIMITIVETYPE_LINES>						(command.state, command.renderTarget, command.program, &vertexPackets[0], numVertexPackets, drawContext, vpalloc);	break; }
				case PRIMITIVETYPE_LINE_STRIP:				{ drawAsPrimitives<PRIMITIVETYPE_LINE_STRIP>				(command.state, command.renderTarget, command.program, &vertexPackets[0], numVertexPackets, drawContext, vpalloc);	break; }
				case PRIMITIVETYPE_LINE_LOOP:				{ drawAsPrimitives<PRIMITIVETYPE_LINE_LOOP>					(command.state, command.renderTarget, command.program, &vertexPackets[0], numVertexPackets, drawContext, vpalloc);	break; }
				case PRIMITIVETYPE_POINTS:					{ drawAsPrimitives<PRIMITIVETYPE_POINTS>					(command.state, command.renderTarget, command.program, &vertexPackets[0], numVertexPackets, drawContext, vpalloc);	break; }
				case PRIMITIVETYPE_LINES_ADJACENCY:			{ drawAsPrimitives<PRIMITIVETYPE_LINES_ADJACENCY>			(command.state, command.renderTarget, command.program, &vertexPackets[0], numVertexPackets, drawContext, vpalloc);	break; }
				case PRIMITIVETYPE_LINE_STRIP_ADJACENCY:	{ drawAsPrimitives<PRIMITIVETYPE_LINE_STRIP_ADJACENCY>		(command.state, command.renderTarget, command.program, &vertexPackets[0], numVertexPackets, drawContext, vpalloc);	break; }
				case PRIMITIVETYPE_TRIANGLES_ADJACENCY:		{ drawAsPrimitives<PRIMITIVETYPE_TRIANGLES_ADJACENCY>		(command.state, command.renderTarget, command.program, &vertexPackets[0], numVertexPackets, drawContext, vpalloc);	break; }
				case PRIMITIVETYPE_TRIANGLE_STRIP_ADJACENCY:{ drawAsPrimitives<PRIMITIVETYPE_TRIANGLE_STRIP_ADJACENCY>	(command.state, command.renderTarget, command.program, &vertexPackets[0], numVertexPackets, drawContext, vpalloc);	break; }
				default:
					DE_ASSERT(DE_FALSE);
			}
		}
	}
}